

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O0

size_t mp_vformat(char *data,size_t data_size,char *format,__va_list_tag *vl)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint32_t uVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  uint *local_290;
  int *local_278;
  uint *local_260;
  int *local_248;
  uint64_t *local_230;
  uint64_t *local_218;
  uint64_t *local_200;
  uint64_t *local_1e8;
  int *local_1d0;
  double *local_1b8;
  double *local_198;
  undefined8 *local_178;
  uint *local_160;
  undefined8 *local_148;
  undefined8 *local_130;
  uint32_t *local_118;
  undefined8 *local_100;
  uint *local_e8;
  int *local_d0;
  _Bool v_2;
  double v_1;
  float v;
  char *p_1;
  uint32_t len_3;
  uint32_t len_2;
  char *end;
  char *p;
  char *str_1;
  uint32_t len_1;
  uint32_t len;
  char *str;
  uint64_t uStack_68;
  int int_status;
  int64_t int_value;
  char *pcStack_58;
  uint32_t size_1;
  char *e_1;
  int level_1;
  uint32_t count;
  char *e;
  int level;
  uint32_t size;
  char *f;
  size_t result;
  __va_list_tag *vl_local;
  char *format_local;
  size_t data_size_local;
  char *data_local;
  
  f = (char *)0x0;
  _level = format;
  result = (size_t)vl;
  vl_local = (__va_list_tag *)format;
  format_local = (char *)data_size;
  data_size_local = (size_t)data;
  do {
    if (*_level == '\0') {
      return (size_t)f;
    }
    if (*_level == '[') {
      e._4_4_ = 0;
      e._0_4_ = 1;
      pcVar7 = _level;
      while( true ) {
        pcVar4 = pcVar7;
        _level_1 = pcVar4 + 1;
        bVar9 = false;
        if ((int)e != 0) {
          bVar9 = *_level_1 != '\0';
        }
        if (!bVar9) break;
        if ((*_level_1 == '[') || (*_level_1 == '{')) {
          if ((int)e == 1) {
            e._4_4_ = e._4_4_ + 1;
          }
          e._0_4_ = (int)e + 1;
          pcVar7 = _level_1;
        }
        else if ((*_level_1 == ']') || (*_level_1 == '}')) {
          e._0_4_ = (int)e + -1;
          pcVar7 = _level_1;
          if (((int)e == 0) && (pcVar7 = _level_1, *_level_1 != ']')) {
            __assert_fail("level || *e == \']\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                          ,0x65,
                          "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
            ;
          }
        }
        else if (*_level_1 == '%') {
          if (pcVar4[2] == '%') {
            pcVar7 = pcVar4 + 2;
          }
          else {
            pcVar7 = _level_1;
            if ((int)e == 1) {
              e._4_4_ = e._4_4_ + 1;
              pcVar7 = _level_1;
            }
          }
        }
        else {
          pcVar7 = _level_1;
          if ((((*_level_1 == 'N') && (pcVar7 = _level_1, pcVar4[2] == 'I')) &&
              (pcVar7 = _level_1, pcVar4[3] == 'L')) && (pcVar7 = _level_1, (int)e == 1)) {
            e._4_4_ = e._4_4_ + 1;
            pcVar7 = _level_1;
          }
        }
      }
      if ((int)e != 0) {
        __assert_fail("level == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x71,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      uVar5 = mp_sizeof_array(e._4_4_);
      f = f + uVar5;
      if (f <= format_local) {
        data_size_local = (size_t)mp_encode_array((char *)data_size_local,e._4_4_);
      }
    }
    else if (*_level == '{') {
      e_1._4_4_ = 0;
      e_1._0_4_ = 1;
      pcVar7 = _level;
      while( true ) {
        pcVar4 = pcVar7;
        pcStack_58 = pcVar4 + 1;
        bVar9 = false;
        if ((int)e_1 != 0) {
          bVar9 = *pcStack_58 != '\0';
        }
        if (!bVar9) break;
        if ((*pcStack_58 == '[') || (*pcStack_58 == '{')) {
          if ((int)e_1 == 1) {
            e_1._4_4_ = e_1._4_4_ + 1;
          }
          e_1._0_4_ = (int)e_1 + 1;
          pcVar7 = pcStack_58;
        }
        else if ((*pcStack_58 == ']') || (*pcStack_58 == '}')) {
          e_1._0_4_ = (int)e_1 + -1;
          pcVar7 = pcStack_58;
          if (((int)e_1 == 0) && (pcVar7 = pcStack_58, *pcStack_58 != '}')) {
            __assert_fail("level || *e == \'}\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                          ,0x82,
                          "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
            ;
          }
        }
        else if (*pcStack_58 == '%') {
          if (pcVar4[2] == '%') {
            pcVar7 = pcVar4 + 2;
          }
          else {
            pcVar7 = pcStack_58;
            if ((int)e_1 == 1) {
              e_1._4_4_ = e_1._4_4_ + 1;
              pcVar7 = pcStack_58;
            }
          }
        }
        else {
          pcVar7 = pcStack_58;
          if ((((*pcStack_58 == 'N') && (pcVar7 = pcStack_58, pcVar4[2] == 'I')) &&
              (pcVar7 = pcStack_58, pcVar4[3] == 'L')) && (pcVar7 = pcStack_58, (int)e_1 == 1)) {
            e_1._4_4_ = e_1._4_4_ + 1;
            pcVar7 = pcStack_58;
          }
        }
      }
      if ((int)e_1 != 0) {
        __assert_fail("level == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x8e,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      if ((e_1._4_4_ & 1) != 0) {
        __assert_fail("count % 2 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x90,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      int_value._4_4_ = e_1._4_4_ >> 1;
      uVar5 = mp_sizeof_map(int_value._4_4_);
      f = f + uVar5;
      if (f <= format_local) {
        data_size_local = (size_t)mp_encode_map((char *)data_size_local,int_value._4_4_);
      }
    }
    else if (*_level == '%') {
      pcVar7 = _level + 1;
      if (*pcVar7 == '\0') {
        _level = pcVar7;
        __assert_fail("f[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x97,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      uStack_68 = 0;
      str._4_4_ = 0;
      if ((*pcVar7 == 'd') || (*pcVar7 == 'i')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_d0 = (int *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_d0 = *(int **)(result + 8);
          *(int **)(result + 8) = local_d0 + 2;
        }
        uStack_68 = (uint64_t)*local_d0;
        str._4_4_ = 1;
        _level = pcVar7;
      }
      else if (*pcVar7 == 'u') {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_e8 = (uint *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_e8 = *(uint **)(result + 8);
          *(uint **)(result + 8) = local_e8 + 2;
        }
        uStack_68 = (uint64_t)*local_e8;
        str._4_4_ = 2;
        _level = pcVar7;
      }
      else if (*pcVar7 == 's') {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_100 = (undefined8 *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_100 = *(undefined8 **)(result + 8);
          *(undefined8 **)(result + 8) = local_100 + 1;
        }
        _len_1 = (char *)*local_100;
        _level = pcVar7;
        sVar8 = strlen(_len_1);
        str_1._4_4_ = (uint32_t)sVar8;
        uVar5 = mp_sizeof_str(str_1._4_4_);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_str((char *)data_size_local,_len_1,str_1._4_4_);
        }
      }
      else if (((*pcVar7 == '.') && (_level[2] == '*')) && (_level[3] == 's')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_118 = (uint32_t *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_118 = *(uint32_t **)(result + 8);
          *(uint32_t **)(result + 8) = local_118 + 2;
        }
        str_1._0_4_ = *local_118;
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_130 = (undefined8 *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_130 = *(undefined8 **)(result + 8);
          *(undefined8 **)(result + 8) = local_130 + 1;
        }
        p = (char *)*local_130;
        _level = pcVar7;
        uVar5 = mp_sizeof_str((uint32_t)str_1);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_str((char *)data_size_local,p,(uint32_t)str_1);
        }
        _level = _level + 2;
      }
      else if (*pcVar7 == 'p') {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_148 = (undefined8 *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_148 = *(undefined8 **)(result + 8);
          *(undefined8 **)(result + 8) = local_148 + 1;
        }
        _len_3 = (char *)*local_148;
        end = _len_3;
        _level = pcVar7;
        mp_next((char **)&len_3);
        uVar6 = (int)_len_3 - (int)end;
        f = f + uVar6;
        if (f <= format_local) {
          memcpy((void *)data_size_local,end,(ulong)uVar6);
          data_size_local = data_size_local + uVar6;
        }
      }
      else if (((*pcVar7 == '.') && (_level[2] == '*')) && (_level[3] == 'p')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_160 = (uint *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_160 = *(uint **)(result + 8);
          *(uint **)(result + 8) = local_160 + 2;
        }
        uVar6 = *local_160;
        uVar2 = *(uint *)result;
        if (uVar2 < 0x29) {
          local_178 = (undefined8 *)((long)(int)uVar2 + *(long *)(result + 0x10));
          *(uint *)result = uVar2 + 8;
        }
        else {
          local_178 = *(undefined8 **)(result + 8);
          *(undefined8 **)(result + 8) = local_178 + 1;
        }
        if (uVar6 == 0) {
          _level = pcVar7;
          __assert_fail("len > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                        ,0xbb,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
        f = f + uVar6;
        _level = pcVar7;
        if (f <= format_local) {
          memcpy((void *)data_size_local,(void *)*local_178,(ulong)uVar6);
          data_size_local = data_size_local + uVar6;
        }
        _level = _level + 2;
      }
      else if (*pcVar7 == 'f') {
        uVar6 = *(uint *)(result + 4);
        if (uVar6 < 0xa1) {
          local_198 = (double *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)(result + 4) = uVar6 + 0x10;
        }
        else {
          local_198 = *(double **)(result + 8);
          *(double **)(result + 8) = local_198 + 1;
        }
        dVar1 = *local_198;
        _level = pcVar7;
        uVar5 = mp_sizeof_float((float)dVar1);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_float((char *)data_size_local,(float)dVar1);
        }
      }
      else if ((*pcVar7 == 'l') && (_level[2] == 'f')) {
        uVar6 = *(uint *)(result + 4);
        if (uVar6 < 0xa1) {
          local_1b8 = (double *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)(result + 4) = uVar6 + 0x10;
        }
        else {
          local_1b8 = *(double **)(result + 8);
          *(double **)(result + 8) = local_1b8 + 1;
        }
        dVar1 = *local_1b8;
        _level = pcVar7;
        uVar5 = mp_sizeof_double(dVar1);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_double((char *)data_size_local,dVar1);
        }
        _level = _level + 1;
      }
      else if (*pcVar7 == 'b') {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_1d0 = (int *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_1d0 = *(int **)(result + 8);
          *(int **)(result + 8) = local_1d0 + 2;
        }
        iVar3 = *local_1d0;
        _level = pcVar7;
        uVar5 = mp_sizeof_bool(iVar3 != 0);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_bool((char *)data_size_local,iVar3 != 0);
        }
      }
      else if ((*pcVar7 == 'l') && ((_level[2] == 'd' || (_level[2] == 'i')))) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_1e8 = (uint64_t *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_1e8 = *(uint64_t **)(result + 8);
          *(uint64_t **)(result + 8) = local_1e8 + 1;
        }
        uStack_68 = *local_1e8;
        str._4_4_ = 1;
        _level = _level + 2;
      }
      else if ((*pcVar7 == 'l') && (_level[2] == 'u')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_200 = (uint64_t *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_200 = *(uint64_t **)(result + 8);
          *(uint64_t **)(result + 8) = local_200 + 1;
        }
        uStack_68 = *local_200;
        str._4_4_ = 2;
        _level = _level + 2;
      }
      else if (((*pcVar7 == 'l') && (_level[2] == 'l')) &&
              ((_level[3] == 'd' || (_level[3] == 'i')))) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_218 = (uint64_t *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_218 = *(uint64_t **)(result + 8);
          *(uint64_t **)(result + 8) = local_218 + 1;
        }
        uStack_68 = *local_218;
        str._4_4_ = 1;
        _level = _level + 3;
      }
      else if (((*pcVar7 == 'l') && (_level[2] == 'l')) && (_level[3] == 'u')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_230 = (uint64_t *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_230 = *(uint64_t **)(result + 8);
          *(uint64_t **)(result + 8) = local_230 + 1;
        }
        uStack_68 = *local_230;
        str._4_4_ = 2;
        _level = _level + 3;
      }
      else if ((*pcVar7 == 'h') && ((_level[2] == 'd' || (_level[2] == 'i')))) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_248 = (int *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_248 = *(int **)(result + 8);
          *(int **)(result + 8) = local_248 + 2;
        }
        uStack_68 = (uint64_t)*local_248;
        str._4_4_ = 1;
        _level = _level + 2;
      }
      else if ((*pcVar7 == 'h') && (_level[2] == 'u')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_260 = (uint *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_260 = *(uint **)(result + 8);
          *(uint **)(result + 8) = local_260 + 2;
        }
        uStack_68 = (uint64_t)*local_260;
        str._4_4_ = 2;
        _level = _level + 2;
      }
      else if (((*pcVar7 == 'h') && (_level[2] == 'h')) &&
              ((_level[3] == 'd' || (_level[3] == 'i')))) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_278 = (int *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_278 = *(int **)(result + 8);
          *(int **)(result + 8) = local_278 + 2;
        }
        uStack_68 = (uint64_t)*local_278;
        str._4_4_ = 1;
        _level = _level + 3;
      }
      else if (((*pcVar7 == 'h') && (_level[2] == 'h')) && (_level[3] == 'u')) {
        uVar6 = *(uint *)result;
        if (uVar6 < 0x29) {
          local_290 = (uint *)((long)(int)uVar6 + *(long *)(result + 0x10));
          *(uint *)result = uVar6 + 8;
        }
        else {
          local_290 = *(uint **)(result + 8);
          *(uint **)(result + 8) = local_290 + 2;
        }
        uStack_68 = (uint64_t)*local_290;
        str._4_4_ = 2;
        _level = _level + 3;
      }
      else {
        _level = pcVar7;
        if (*pcVar7 != '%') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                        ,0xf8,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
      }
      if ((str._4_4_ == 1) && ((long)uStack_68 < 0)) {
        uVar5 = mp_sizeof_int(uStack_68);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_int((char *)data_size_local,uStack_68);
        }
      }
      else if (str._4_4_ != 0) {
        uVar5 = mp_sizeof_uint(uStack_68);
        f = f + uVar5;
        if (f <= format_local) {
          data_size_local = (size_t)mp_encode_uint((char *)data_size_local,uStack_68);
        }
      }
    }
    else if (((*_level == 'N') && (_level[1] == 'I')) && (_level[2] == 'L')) {
      uVar5 = mp_sizeof_nil();
      f = f + uVar5;
      if (f <= format_local) {
        data_size_local = (size_t)mp_encode_nil((char *)data_size_local);
      }
      _level = _level + 2;
    }
    _level = _level + 1;
  } while( true );
}

Assistant:

size_t
mp_vformat(char *data, size_t data_size, const char *format, va_list vl)
{
	size_t result = 0;
	const char *f = NULL;

	for (f = format; *f; f++) {
		if (f[0] == '[') {
			uint32_t size = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						size++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '[' must be closed by ']' */
					assert(level || *e == ']');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						size++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					size++;
				}
			}
			/* opened '[' must be closed */
			assert(level == 0);
			result += mp_sizeof_array(size);
			if (result <= data_size)
				data = mp_encode_array(data, size);
		} else if (f[0] == '{') {
			uint32_t count = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						count++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '{' must be closed by '}' */
					assert(level || *e == '}');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						count++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					count++;
				}
			}
			/* opened '{' must be closed */
			assert(level == 0);
			/* since map is a pair list, count must be even */
			assert(count % 2 == 0);
			uint32_t size = count / 2;
			result += mp_sizeof_map(size);
			if (result <= data_size)
				data = mp_encode_map(data, size);
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
				f += 2;
			} else if (f[0] == 'p') {
				const char *p = va_arg(vl, const char *);
				const char *end = p;
				mp_next(&end);
				uint32_t len = (uint32_t)(end - p);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 'p') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *p = va_arg(vl, const char *);
				assert(len > 0);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
				f += 2;
			} else if(f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				result += mp_sizeof_float(v);
				if (result <= data_size)
					data = mp_encode_float(data, v);
			} else if(f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				result += mp_sizeof_double(v);
				if (result <= data_size)
					data = mp_encode_double(data, v);
				f++;
			} else if(f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				result += mp_sizeof_bool(v);
				if (result <= data_size)
					data = mp_encode_bool(data, v);
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1 && int_value < 0) {
				result += mp_sizeof_int(int_value);
				if (result <= data_size)
					data = mp_encode_int(data, int_value);
			} else if(int_status) {
				result += mp_sizeof_uint(int_value);
				if (result <= data_size)
					data = mp_encode_uint(data, int_value);
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			result += mp_sizeof_nil();
			if (result <= data_size)
				data = mp_encode_nil(data);
			f += 2;
		}
	}
	return result;
}